

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_testing::internal::CastAndAppendTransform<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
::operator()(IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
             *this,tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>
                   *param_2,
            IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
            *param_3)

{
  __tuple_element_t<0UL,_tuple<opt<basic_string<char>,_parser<std::string>_>_*>_> *a;
  back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
  *this_00;
  back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
  bVar1;
  IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_0UL>
  local_5d [13];
  back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
  local_50;
  Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> local_48;
  tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>
  *local_30;
  tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>
  *t_local;
  IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
  *this_local;
  back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
  out_local;
  
  local_30 = param_2;
  t_local = (tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>
             *)this;
  this_local = param_3;
  a = std::
      get<0ul,pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>
                (param_2);
  CastAndAppendTransform<pstore::gsl::not_null<pstore::command_line::option_const*>const&>::
  operator()(&local_48,
             (CastAndAppendTransform<pstore::gsl::not_null<pstore::command_line::option_const*>const&>
              *)((long)&out_local.container + 7),a);
  local_50 = std::
             back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
             ::operator++((back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
                           *)&this_local,0);
  this_00 = std::
            back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
            ::operator*(&local_50);
  std::
  back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
  ::operator=(this_00,&local_48);
  Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::~Matcher(&local_48);
  bVar1 = IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_0UL>
          ::operator()(local_5d,local_30,this_local);
  return (back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator() (Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }